

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O1

Vec_Vec_t * Cgt_ManDecideSimple(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  void *pvVar1;
  Aig_Obj_t *pCand;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Vec_t *p;
  void **ppvVar6;
  undefined8 *puVar7;
  Ssw_Sml_t *p_00;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  Aig_Obj_t *Entry;
  ulong uVar12;
  float fVar13;
  timespec ts;
  uint local_84;
  long local_70;
  timespec local_58;
  Aig_Man_t *local_48;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    local_70 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_70 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  uVar3 = pAig->nRegs;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar3 - 1) {
    uVar8 = uVar3;
  }
  p->nSize = 0;
  p->nCap = uVar8;
  if (uVar8 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar8 << 3);
  }
  p->pArray = ppvVar6;
  if (0 < (int)uVar3) {
    uVar12 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar12] = puVar7;
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
  p->nSize = uVar3;
  local_84 = 0;
  p_00 = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  if (0 < pAig->nRegs) {
    lVar9 = 0;
    local_84 = 0;
    local_48 = pAig;
    do {
      iVar2 = (int)lVar9;
      uVar3 = local_48->nTruePos + iVar2;
      if (((((int)uVar3 < 0) || (local_48->vCos->nSize <= (int)uVar3)) ||
          (uVar8 = local_48->nTruePis + iVar2, (int)uVar8 < 0)) ||
         (local_48->vCis->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (vGatesAll->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar1 = vGatesAll->pArray[lVar9];
      if (*(int *)((long)pvVar1 + 4) < 1) {
        Entry = (Aig_Obj_t *)0x0;
      }
      else {
        local_38 = (Aig_Obj_t *)local_48->vCos->pArray[uVar3];
        local_40 = (Aig_Obj_t *)local_48->vCis->pArray[uVar8];
        lVar10 = 0;
        Entry = (Aig_Obj_t *)0x0;
        iVar11 = 0;
        do {
          pCand = *(Aig_Obj_t **)(*(long *)((long)pvVar1 + 8) + lVar10 * 8);
          if ((nOdcMax == 0) &&
             (iVar4 = Ssw_SmlCheckXorImplication(p_00,local_38,local_40,pCand), iVar4 == 0)) {
            puts("Clock gate candidate is invalid!");
          }
          iVar5 = Ssw_SmlNodeCountOnesReal(p_00,pCand);
          iVar4 = iVar11;
          if (iVar11 <= iVar5) {
            iVar4 = iVar5;
          }
          if (iVar11 < iVar5) {
            Entry = pCand;
          }
          lVar10 = lVar10 + 1;
          iVar11 = iVar4;
        } while (lVar10 < *(int *)((long)pvVar1 + 4));
      }
      if (Entry != (Aig_Obj_t *)0x0) {
        Vec_VecPush(p,iVar2,Entry);
        local_84 = local_84 + 1;
      }
      lVar9 = lVar9 + 1;
      pAig = local_48;
    } while (lVar9 < local_48->nRegs);
  }
  Ssw_SmlStop(p_00);
  if (fVerbose != 0) {
    if ((long)vGatesAll->nSize < 1) {
      uVar12 = 0;
    }
    else {
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)vGatesAll->pArray[lVar9] + 4));
        lVar9 = lVar9 + 1;
      } while (vGatesAll->nSize != lVar9);
    }
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",uVar12,(ulong)local_84,
           (ulong)(uint)pAig->nRegs);
    fVar13 = Cgt_ManComputeCoverage(pAig,p);
    iVar2 = 0x8daaeb;
    printf("Gated transitions = %5.2f %%. ",SUB84((double)fVar13,0));
    Abc_Print(iVar2,"%s =","Time");
    iVar11 = 3;
    iVar2 = clock_gettime(3,&local_58);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)(lVar9 + local_70) / 1000000.0,0));
  }
  return p;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideSimple( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObjLi, * pObjLo, * pCand, * pCandBest;
    int i, k, nHitsCur, nHitsMax, Counter = 0;
    abctime clk = Abc_Clock();
    int nTransTotal = 0, nTransSaved = 0;
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        nHitsMax = 0;
        pCandBest = NULL;
        vCands = Vec_VecEntry( vGatesAll, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pCand, k )
        {
            // check if this is indeed a clock-gate
            if ( nOdcMax == 0 && !Ssw_SmlCheckXorImplication( pSml, pObjLi, pObjLo, pCand ) )
                printf( "Clock gate candidate is invalid!\n" );
            // find its characteristic number
            nHitsCur = Ssw_SmlNodeCountOnesReal( pSml, pCand );
            if ( nHitsMax < nHitsCur )
            {
                nHitsMax = nHitsCur;
                pCandBest = pCand;
            }
        }
        if ( pCandBest != NULL )
        {
            Vec_VecPush( vGates, i, pCandBest );
            Counter++;
            nTransSaved += nHitsMax;
        }
        nTransTotal += 32 * nFrames * nWords;
    }
    Ssw_SmlStop( pSml );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
//        printf( "Gated transitions = %5.2f %%. (%5.2f %%.) ", 
//            100.0*nTransSaved/nTransTotal, Cgt_ManComputeCoverage(pAig, vGates) );
        printf( "Gated transitions = %5.2f %%. ", Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
/*
    {
        Vec_Ptr_t * vCompletes;
        vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
        printf( "Complete gates = %d. \n", Vec_PtrSize(vCompletes) );
        Vec_PtrFree( vCompletes );
    }
*/
    return vGates;
}